

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqComms.cpp
# Opt level: O1

void __thiscall helics::zeromq::ZmqComms::loadNetworkInfo(ZmqComms *this,NetworkBrokerData *netInfo)

{
  string *networkAddress;
  string *networkAddress_00;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  
  NetworkCommsInterface::loadNetworkInfo(&this->super_NetworkCommsInterface,netInfo);
  bVar1 = CommsInterface::propertyLock((CommsInterface *)this);
  if (!bVar1) {
    return;
  }
  networkAddress = &(this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress;
  if ((this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress._M_string_length
      != 0) {
    gmlc::networking::insertProtocol(networkAddress,TCP);
  }
  networkAddress_00 = &(this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress;
  if ((this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress._M_string_length
      != 0) {
    gmlc::networking::insertProtocol(networkAddress_00,TCP);
  }
  iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  networkAddress_00,"tcp://localhost");
  if (iVar2 == 0) {
    pcVar3 = "tcp://127.0.0.1";
LAB_002cad17:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               networkAddress_00,0,
               (this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress.
               _M_string_length,pcVar3,0xf);
  }
  else {
    iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    networkAddress_00,"udp://localhost");
    if (iVar2 == 0) {
      pcVar3 = "udp://127.0.0.1";
      goto LAB_002cad17;
    }
  }
  iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  networkAddress,"tcp://localhost");
  if (iVar2 == 0) {
    pcVar3 = "tcp://127.0.0.1";
  }
  else {
    iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    networkAddress,"udp://localhost");
    if (iVar2 != 0) goto LAB_002cad7b;
    pcVar3 = "udp://127.0.0.1";
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)networkAddress,0,
             (this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress.
             _M_string_length,pcVar3,0xf);
LAB_002cad7b:
  CommsInterface::propertyUnLock((CommsInterface *)this);
  return;
}

Assistant:

void ZmqComms::loadNetworkInfo(const NetworkBrokerData& netInfo)
{
    NetworkCommsInterface::loadNetworkInfo(netInfo);
    if (!propertyLock()) {
        return;
    }
    if (!brokerTargetAddress.empty()) {
        gmlc::networking::insertProtocol(brokerTargetAddress,
                                         gmlc::networking::InterfaceTypes::TCP);
    }
    if (!localTargetAddress.empty()) {
        gmlc::networking::insertProtocol(localTargetAddress, gmlc::networking::InterfaceTypes::TCP);
    }
    if (localTargetAddress == "tcp://localhost") {
        localTargetAddress = "tcp://127.0.0.1";
    } else if (localTargetAddress == "udp://localhost") {
        localTargetAddress = "udp://127.0.0.1";
    }
    if (brokerTargetAddress == "tcp://localhost") {
        brokerTargetAddress = "tcp://127.0.0.1";
    } else if (brokerTargetAddress == "udp://localhost") {
        brokerTargetAddress = "udp://127.0.0.1";
    }
    propertyUnLock();
}